

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O0

void t49(void)

{
  byte bVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char *pcVar5;
  _Bool ok_7;
  _Bool ok_6;
  _Bool ok_5;
  _Bool ok_4;
  _Bool ok_3;
  _Bool ok_2;
  _Bool ok_1;
  _Bool ok;
  ALLEGRO_USTR *repl;
  ALLEGRO_USTR *find;
  ALLEGRO_USTR_INFO repli;
  ALLEGRO_USTR_INFO findi;
  ALLEGRO_USTR *us;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  undefined8 local_8;
  
  local_8 = al_ustr_new(anon_var_dwarf_ba6);
  uVar3 = al_ref_cstr(local_18,anon_var_dwarf_476 + 5);
  uVar4 = al_ref_cstr(local_28,"deef");
  bVar1 = al_ustr_find_replace(local_8,0,uVar3,uVar4);
  if ((bVar1 & 1) == 0) {
    log_printf("FAIL %s\n","al_ustr_find_replace(us, 0, find, repl)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_find_replace(us, 0, find, repl)");
  }
  pcVar5 = (char *)al_cstr(local_8);
  iVar2 = strcmp(pcVar5,anon_var_dwarf_14f3);
  if (iVar2 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_14ff);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_14ff);
    error = error + 1;
  }
  uVar3 = al_ref_cstr(local_18,anon_var_dwarf_1517);
  uVar4 = al_ref_cstr(local_28,anon_var_dwarf_1523);
  bVar1 = al_ustr_find_replace(local_8,0xe,uVar3,uVar4);
  if ((bVar1 & 1) == 0) {
    log_printf("FAIL %s\n","al_ustr_find_replace(us, 14, find, repl)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_find_replace(us, 14, find, repl)");
  }
  pcVar5 = (char *)al_cstr(local_8);
  iVar2 = strcmp(pcVar5,anon_var_dwarf_153b);
  if (iVar2 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_1547);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_1547);
    error = error + 1;
  }
  bVar1 = al_ustr_find_replace_cstr(local_8,0,"dd",anon_var_dwarf_155f);
  if ((bVar1 & 1) == 0) {
    log_printf("FAIL %s\n",anon_var_dwarf_156b);
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n",anon_var_dwarf_156b);
  }
  pcVar5 = (char *)al_cstr(local_8);
  iVar2 = strcmp(pcVar5,anon_var_dwarf_1577);
  if (iVar2 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_1583);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_1583);
    error = error + 1;
  }
  uVar3 = al_ustr_empty_string();
  bVar1 = al_ustr_find_replace(local_8,0,uVar3,uVar4);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    log_printf("FAIL %s\n","! al_ustr_find_replace(us, 0, find, repl)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","! al_ustr_find_replace(us, 0, find, repl)");
  }
  pcVar5 = (char *)al_cstr(local_8);
  iVar2 = strcmp(pcVar5,anon_var_dwarf_1577);
  if (iVar2 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_1583);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_1583);
    error = error + 1;
  }
  al_ustr_free(local_8);
  return;
}

Assistant:

static void t49(void)
{
   ALLEGRO_USTR *us;
   ALLEGRO_USTR_INFO findi;
   ALLEGRO_USTR_INFO repli;
   const ALLEGRO_USTR *find;
   const ALLEGRO_USTR *repl;

   us = al_ustr_new("aábdðeéfghiíaábdðeéfghií");
   find = al_ref_cstr(&findi, "ðeéf");
   repl = al_ref_cstr(&repli, "deef");

   CHECK(al_ustr_find_replace(us, 0, find, repl));
   CHECK(0 == strcmp(al_cstr(us), "aábddeefghiíaábddeefghií"));

   find = al_ref_cstr(&findi, "aá");
   repl = al_ref_cstr(&repli, "AÁ");

   CHECK(al_ustr_find_replace(us, 14, find, repl));
   CHECK(0 == strcmp(al_cstr(us), "aábddeefghiíAÁbddeefghií"));

   CHECK(al_ustr_find_replace_cstr(us, 0, "dd", "đ"));
   CHECK(0 == strcmp(al_cstr(us), "aábđeefghiíAÁbđeefghií"));

   /* Not allowed */
   find = al_ustr_empty_string();
   CHECK(! al_ustr_find_replace(us, 0, find, repl));
   CHECK(0 == strcmp(al_cstr(us), "aábđeefghiíAÁbđeefghií"));

   al_ustr_free(us);
}